

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void drop_item(tgestate_t *state)

{
  undefined1 *puVar1;
  long in_RDI;
  tgestate_t *unaff_retaddr;
  attribute_t attrs;
  item_t tmpitem;
  item_t *itemp;
  item_t item;
  sound_t in_stack_ffffffffffffffdc;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 uVar2;
  attribute_t attrs_00;
  undefined7 in_stack_fffffffffffffff0;
  char cVar3;
  item_t item_00;
  
  cVar3 = *(char *)(in_RDI + 0x6e4);
  if (cVar3 != -1) {
    if (cVar3 == '\x06') {
      *(undefined8 *)(in_RDI + 1000) = 0x1237e0;
    }
    uVar2 = *(undefined1 *)(in_RDI + 0x6e5);
    puVar1 = (undefined1 *)(in_RDI + 0x6e4);
    *(undefined1 *)(in_RDI + 0x6e5) = 0xff;
    *puVar1 = uVar2;
    draw_all_items((tgestate_t *)0x107f72);
    attrs_00 = (attribute_t)((ulong)puVar1 >> 0x38);
    item_00 = (item_t)((ulong)in_RDI >> 0x38);
    play_speaker((tgestate_t *)
                 CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)),
                 in_stack_ffffffffffffffdc);
    choose_game_window_attributes
              ((tgestate_t *)
               CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)));
    set_game_window_attributes((tgestate_t *)CONCAT17(cVar3,in_stack_fffffffffffffff0),attrs_00);
    drop_item_tail(unaff_retaddr,item_00);
  }
  return;
}

Assistant:

void drop_item(tgestate_t *state)
{
  item_t      item;    /* was A */
  item_t     *itemp;   /* was HL */
  item_t      tmpitem; /* was A */
  attribute_t attrs;   /* was A */

  assert(state != NULL);

  /* Return if no items held. */
  item = state->items_held[0];
  if (item == item_NONE)
    return;

  /* When dropping the uniform reset the player sprite. */
  if (item == item_UNIFORM)
    state->vischars[0].mi.sprite = &sprites[sprite_PRISONER_FACING_AWAY_1];

  /* Shuffle items down. */
  itemp = &state->items_held[1];
  tmpitem = *itemp;
  *itemp-- = item_NONE;
  *itemp = tmpitem;

  draw_all_items(state);
  play_speaker(state, sound_DROP_ITEM);
  attrs = choose_game_window_attributes(state);
  set_game_window_attributes(state, attrs);

  drop_item_tail(state, item);
}